

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O1

void rndmappos(xchar *x,xchar *y)

{
  char cVar1;
  char cVar2;
  xchar xVar3;
  uint uVar4;
  
  cVar1 = *x;
  cVar2 = 'P';
  if (cVar1 < 'P') {
    if (cVar1 == -1) {
      uVar4 = mt_random();
      cVar2 = (char)uVar4 + (char)(uVar4 / 0x4f) * -0x4f + '\x01';
    }
    else {
      if ('\0' < cVar1) goto LAB_001aca0f;
      cVar2 = '\x01';
    }
  }
  *x = cVar2;
LAB_001aca0f:
  cVar1 = *y;
  xVar3 = '\x15';
  if (cVar1 < '\x15') {
    if (cVar1 == -1) {
      uVar4 = mt_random();
      xVar3 = (xchar)(uVar4 % 0x15);
    }
    else {
      if (-1 < cVar1) {
        return;
      }
      xVar3 = '\0';
    }
  }
  *y = xVar3;
  return;
}

Assistant:

static void rndmappos(xchar *x, xchar *y)
{
	if (*x >= COLNO) *x = COLNO;
	else if (*x == -1) *x = rn2(COLNO - 1) + 1;
	else if (*x < 1) *x = 1;

	if (*y >= ROWNO) *y = ROWNO;
	else if (*y == -1) *y = rn2(ROWNO);
	else if (*y < 0) *y = 0;
}